

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pshrec.c
# Opt level: O1

void ps_mask_table_done(PS_Mask_Table table,FT_Memory memory)

{
  FT_Byte **ppFVar1;
  FT_UInt FVar2;
  
  FVar2 = table->max_masks;
  if (FVar2 != 0) {
    ppFVar1 = &table->masks->bytes;
    do {
      ft_mem_free(memory,*ppFVar1);
      ((PS_MaskRec_ *)(ppFVar1 + -1))->num_bits = 0;
      ((PS_MaskRec_ *)(ppFVar1 + -1))->max_bits = 0;
      *ppFVar1 = (FT_Byte *)0x0;
      *(FT_UInt *)(ppFVar1 + 1) = 0;
      ppFVar1 = ppFVar1 + 3;
      FVar2 = FVar2 - 1;
    } while (FVar2 != 0);
  }
  ft_mem_free(memory,table->masks);
  table->num_masks = 0;
  table->max_masks = 0;
  table->masks = (PS_Mask)0x0;
  return;
}

Assistant:

static void
  ps_mask_table_done( PS_Mask_Table  table,
                      FT_Memory      memory )
  {
    FT_UInt  count = table->max_masks;
    PS_Mask  mask  = table->masks;


    for ( ; count > 0; count--, mask++ )
      ps_mask_done( mask, memory );

    FT_FREE( table->masks );
    table->num_masks = 0;
    table->max_masks = 0;
  }